

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotScatterEx<ImPlot::GetterYs<double>>(char *label_id,GetterYs<double> *getter)

{
  GetterYs<double> getter_00;
  GetterYs<double> getter_01;
  GetterYs<double> getter_02;
  GetterYs<double> getter_03;
  bool bVar1;
  ImPlotScale IVar2;
  ImU32 local_110;
  TransformerLogLog local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  TransformerLinLog local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  TransformerLogLin local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  TransformerLinLin local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ImU32 local_4c;
  ImU32 local_48;
  ImU32 col_fill;
  ImU32 col_line;
  ImPlotMarker marker;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint p;
  int i;
  GetterYs<double> *getter_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,2);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (p.y._4_4_ = 0; p.y._4_4_ < getter->Count; p.y._4_4_ = p.y._4_4_ + 1) {
        _s = GetterYs<double>::operator()(getter,p.y._4_4_);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    _col_line = GetPlotDrawList();
    if (*(int *)((long)&DrawList->_IdxWritePtr + 4) == -1) {
      local_110 = 0;
    }
    else {
      local_110 = *(ImU32 *)((long)&DrawList->_IdxWritePtr + 4);
    }
    col_fill = local_110;
    if (local_110 != 0xffffffff) {
      local_48 = ImGui::GetColorU32((ImVec4 *)&DrawList->VtxBuffer);
      local_4c = ImGui::GetColorU32((ImVec4 *)&DrawList->Flags);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        memcpy(&local_78,getter,0x28);
        TransformerLinLin::TransformerLinLin(&local_7c);
        getter_00._8_8_ = uStack_70;
        getter_00.Ys = (double *)local_78;
        getter_00.XScale = (double)local_68;
        getter_00.X0 = (double)uStack_60;
        getter_00.Offset = (undefined4)local_58;
        getter_00.Stride = local_58._4_4_;
        RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<double>>
                  (getter_00,local_7c,_col_line,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_48,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_4c);
        break;
      case 1:
        memcpy(&local_a8,getter,0x28);
        TransformerLogLin::TransformerLogLin(&local_ac);
        getter_01._8_8_ = uStack_a0;
        getter_01.Ys = (double *)local_a8;
        getter_01.XScale = (double)local_98;
        getter_01.X0 = (double)uStack_90;
        getter_01.Offset = (undefined4)local_88;
        getter_01.Stride = local_88._4_4_;
        RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<double>>
                  (getter_01,local_ac,_col_line,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_48,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_4c);
        break;
      case 2:
        memcpy(&local_d8,getter,0x28);
        TransformerLinLog::TransformerLinLog(&local_dc);
        getter_02._8_8_ = uStack_d0;
        getter_02.Ys = (double *)local_d8;
        getter_02.XScale = (double)local_c8;
        getter_02.X0 = (double)uStack_c0;
        getter_02.Offset = (undefined4)local_b8;
        getter_02.Stride = local_b8._4_4_;
        RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<double>>
                  (getter_02,local_dc,_col_line,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_48,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_4c);
        break;
      case 3:
        memcpy(&local_108,getter,0x28);
        TransformerLogLog::TransformerLogLog(&local_10c);
        getter_03._8_8_ = uStack_100;
        getter_03.Ys = (double *)local_108;
        getter_03.XScale = (double)local_f8;
        getter_03.X0 = (double)uStack_f0;
        getter_03.Offset = (undefined4)local_e8;
        getter_03.Stride = local_e8._4_4_;
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<double>>
                  (getter_03,local_10c,_col_line,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_48,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_4c);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}